

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::from_best(SSPMSolver *this,int idx)

{
  int iVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  
  iVar1 = this->l;
  if (0 < (long)iVar1) {
    puVar2 = (this->pm_b)._bits;
    puVar3 = (this->best_b)._bits;
    uVar7 = 0;
    do {
      uVar10 = (long)(idx * iVar1) + uVar7;
      uVar8 = 1L << (uVar10 & 0x3f);
      uVar10 = uVar10 >> 6;
      if ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        uVar9 = ~uVar8 & puVar2[uVar10];
      }
      else {
        uVar9 = uVar8 | puVar2[uVar10];
      }
      puVar2[uVar10] = uVar9;
      uVar7 = uVar7 + 1;
    } while ((long)iVar1 != uVar7);
  }
  if (0 < this->l) {
    piVar4 = this->best_d;
    piVar5 = this->pm_d;
    lVar6 = 0;
    do {
      piVar5[idx * iVar1 + lVar6] = piVar4[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->l);
  }
  return;
}

Assistant:

void
SSPMSolver::from_best(int idx)
{
    int base = idx*l;
    for (int i=0; i<l; i++) pm_b[base+i] = best_b[i];
    for (int i=0; i<l; i++) pm_d[base+i] = best_d[i];
}